

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O2

void __thiscall
kj::StringTree::StringTree(StringTree *this,Array<kj::StringTree> *pieces,StringPtr delim)

{
  Array<kj::StringTree::Branch> *__return_storage_ptr__;
  size_t sVar1;
  Branch *pBVar2;
  uint uVar3;
  long lVar4;
  size_t sVar5;
  char *pcVar6;
  ulong uVar7;
  StringTree *pSVar8;
  size_t __n;
  Array<char> local_48;
  
  __return_storage_ptr__ = &this->branches;
  (this->text).content.size_ = 0;
  (this->text).content.disposer = (ArrayDisposer *)0x0;
  this->size_ = 0;
  (this->text).content.ptr = (char *)0x0;
  heapArray<kj::StringTree::Branch>(__return_storage_ptr__,pieces->size_);
  sVar1 = pieces->size_;
  if (sVar1 != 0) {
    if ((sVar1 != 1) && (lVar4 = delim.content.size_ - 1, lVar4 != 0)) {
      heapString((String *)&local_48,(sVar1 - 1) * lVar4);
      Array<char>::operator=(&(this->text).content,&local_48);
      Array<char>::~Array(&local_48);
      sVar1 = (this->text).content.size_;
      sVar5 = 0;
      if (sVar1 != 0) {
        sVar5 = sVar1 - 1;
      }
      this->size_ = sVar5;
    }
    pBVar2 = __return_storage_ptr__->ptr;
    pBVar2->index = 0;
    operator=(&pBVar2->content,pieces->ptr);
    pSVar8 = pieces->ptr;
    this->size_ = this->size_ + pSVar8->size_;
    __n = delim.content.size_ - 1;
    uVar3 = 0;
    while( true ) {
      uVar7 = (ulong)(uVar3 + 1);
      if (pieces->size_ <= uVar7) break;
      if (__n != 0) {
        pcVar6 = (char *)(this->text).content.size_;
        if (pcVar6 != (char *)0x0) {
          pcVar6 = (this->text).content.ptr;
        }
        memcpy(pcVar6 + uVar3 * __n,delim.content.ptr,__n);
        pSVar8 = pieces->ptr;
      }
      pBVar2 = __return_storage_ptr__->ptr;
      pBVar2[uVar7].index = __n * uVar7;
      operator=(&pBVar2[uVar7].content,pSVar8 + uVar7);
      pSVar8 = pieces->ptr;
      this->size_ = this->size_ + pSVar8[uVar7].size_;
      uVar3 = uVar3 + 1;
    }
  }
  return;
}

Assistant:

StringTree::StringTree(Array<StringTree>&& pieces, StringPtr delim)
    : size_(0),
      branches(heapArray<Branch>(pieces.size())) {
  if (pieces.size() > 0) {
    if (pieces.size() > 1 && delim.size() > 0) {
      text = heapString((pieces.size() - 1) * delim.size());
      size_ = text.size();
    }

    branches[0].index = 0;
    branches[0].content = kj::mv(pieces[0]);
    size_ += pieces[0].size();

    for (uint i = 1; i < pieces.size(); i++) {
      if (delim.size() > 0) {
        memcpy(text.begin() + (i - 1) * delim.size(), delim.begin(), delim.size());
      }
      branches[i].index = i * delim.size();
      branches[i].content = kj::mv(pieces[i]);
      size_ += pieces[i].size();
    }
  }
}